

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O1

void __thiscall
TextReaderTest_InvalidNumOptions_Test::TestBody(TextReaderTest_InvalidNumOptions_Test *this)

{
  StringRef line;
  bool bVar1;
  char *pcVar2;
  StringRef line_00;
  StringRef line_01;
  StringRef line_02;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_3;
  AssertHelper local_188;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  undefined1 local_178 [16];
  string local_168;
  AssertionResult local_148;
  uint local_134;
  NLHeader local_130;
  
  local_168._M_dataplus._M_p._0_4_ = 0;
  line_00.size_ = 2;
  line_00.data_ = "ga";
  ReadHeader(&local_130,0,line_00);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_188,"0","ReadHeader(0, \"ga\").num_ampl_options",
             (int *)(local_178 + 0x10),(int *)((long)&local_130 + 0xac));
  if (local_188.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_130);
    if (local_180.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_180.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_178 + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0xe3,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_178 + 0x10),(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_178 + 0x10));
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_130.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_130.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_130.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ + 8))();
      }
      local_130.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_168._M_dataplus._M_p._0_4_ = 0;
  line_01.size_ = 3;
  line_01.data_ = "g-1";
  ReadHeader(&local_130,0,line_01);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_188,"0","ReadHeader(0, \"g-1\").num_ampl_options",
             (int *)(local_178 + 0x10),(int *)((long)&local_130 + 0xac));
  if (local_188.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_130);
    if (local_180.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_180.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_178 + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0xe4,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_178 + 0x10),(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_178 + 0x10));
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_130.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_130.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_130.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ + 8))();
      }
      local_130.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_168._M_dataplus._M_p == '\x01') {
    local_188.data_ = (AssertHelperData *)local_178;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_188,"(input):1:2: too many options","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      line_02.size_ = 3;
      line_02.data_ = "g10";
      ReadHeader(&local_130,0,line_02);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)(local_178 + 0x10),
               (char (*) [99])
               "Expected: ReadHeader(0, \"g10\") throws an exception of type ReadError.\n  Actual: it throws nothing."
              );
    if (local_188.data_ != (AssertHelperData *)local_178) {
      operator_delete(local_188.data_,local_178._0_8_ + 1);
    }
  }
  testing::Message::Message((Message *)&local_130);
  if ((pointer)local_168._M_string_length == (pointer)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = *(char **)local_168._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_188,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0xe6,pcVar2);
  testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_130);
  testing::internal::AssertHelper::~AssertHelper(&local_188);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_130.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_130.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_130.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ + 8))();
    }
    local_130.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_168._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_148.success_ == true) {
    local_188.data_ = (AssertHelperData *)local_178;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_188,"(input):1:2: number is too big","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_134 = 0x80000000;
      fmt::format<unsigned_int>((string *)(local_178 + 0x10),(CStringRef)0x25f54d,&local_134);
      line.data_._4_4_ = local_168._M_dataplus._M_p._4_4_;
      line.data_._0_4_ = (int)local_168._M_dataplus._M_p;
      line.size_ = local_168._M_string_length;
      ReadHeader(&local_130,0,line);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_168._M_dataplus._M_p._4_4_,(int)local_168._M_dataplus._M_p) !=
          &local_168.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_168._M_dataplus._M_p._4_4_,(int)local_168._M_dataplus._M_p),
                        local_168.field_2._M_allocated_capacity + 1);
      }
    }
    testing::AssertionResult::operator<<
              (&local_148,
               (char (*) [151])
               "Expected: ReadHeader(0, fmt::format(\"g{}\", static_cast<unsigned>(2147483647) + 1)) throws an exception of type ReadError.\n  Actual: it throws nothing."
              );
    if (local_188.data_ != (AssertHelperData *)local_178) {
      operator_delete(local_188.data_,local_178._0_8_ + 1);
    }
  }
  testing::Message::Message((Message *)&local_130);
  if (local_148.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_148.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_188,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0xe9,pcVar2);
  testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_130);
  testing::internal::AssertHelper::~AssertHelper(&local_188);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_130.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_130.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_130.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ + 8))();
    }
    local_130.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_148.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  return;
}

Assistant:

TEST(TextReaderTest, InvalidNumOptions) {
  EXPECT_EQ(0, ReadHeader(0, "ga").num_ampl_options);
  EXPECT_EQ(0, ReadHeader(0, "g-1").num_ampl_options);
  EXPECT_THROW_MSG(ReadHeader(0, "g10"),
      ReadError, "(input):1:2: too many options");
  EXPECT_THROW_MSG(ReadHeader(0,
      fmt::format("g{}", static_cast<unsigned>(INT_MAX) + 1)),
      ReadError, "(input):1:2: number is too big");
}